

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O3

int MMDB_get_entry_data_list(MMDB_entry_s *start,MMDB_entry_data_list_s **entry_data_list)

{
  int iVar1;
  MMDB_data_pool_s *pool;
  MMDB_entry_data_list_s *pMVar2;
  
  *entry_data_list = (MMDB_entry_data_list_s *)0x0;
  pool = data_pool_new(0x40);
  if (pool == (MMDB_data_pool_s *)0x0) {
    iVar1 = 5;
  }
  else {
    pMVar2 = data_pool_alloc(pool);
    iVar1 = 5;
    if ((pMVar2 != (MMDB_entry_data_list_s *)0x0) &&
       (iVar1 = get_entry_data_list(start->mmdb,start->offset,pMVar2,pool,0), iVar1 == 0)) {
      pMVar2 = data_pool_to_list(pool);
      *entry_data_list = pMVar2;
      iVar1 = 5;
      if (pMVar2 != (MMDB_entry_data_list_s *)0x0) {
        return 0;
      }
    }
    data_pool_destroy(pool);
  }
  return iVar1;
}

Assistant:

int MMDB_get_entry_data_list(MMDB_entry_s *start,
                             MMDB_entry_data_list_s **const entry_data_list) {
    *entry_data_list = NULL;

    MMDB_data_pool_s *const pool = data_pool_new(MMDB_POOL_INIT_SIZE);
    if (!pool) {
        return MMDB_OUT_OF_MEMORY_ERROR;
    }

    MMDB_entry_data_list_s *const list = data_pool_alloc(pool);
    if (!list) {
        data_pool_destroy(pool);
        return MMDB_OUT_OF_MEMORY_ERROR;
    }

    int const status =
        get_entry_data_list(start->mmdb, start->offset, list, pool, 0);
    if (MMDB_SUCCESS != status) {
        data_pool_destroy(pool);
        return status;
    }

    *entry_data_list = data_pool_to_list(pool);
    if (!*entry_data_list) {
        data_pool_destroy(pool);
        return MMDB_OUT_OF_MEMORY_ERROR;
    }

    return status;
}